

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaSi.cpp
# Opt level: O3

PT __thiscall Hpipe::DaSi::find(DaSi *this,char c)

{
  PT PVar1;
  PT PVar2;
  
  PVar1 = *(PT *)(this + 8);
  if (PVar1 == 0) {
    PVar2 = 0;
  }
  else {
    PVar2 = 0;
    while (*(char *)(*(long *)this + PVar2) != c) {
      PVar2 = PVar2 + 1;
      if (PVar1 == PVar2) {
        return PVar1;
      }
    }
  }
  return PVar2;
}

Assistant:

PT DaSi::find( char c ) const {
    for( PT i = 0; ; ++i )
        if ( i == size or data[ i ] == c )
            return i;
}